

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O3

void re2::FactorAlternationImpl::Round2
               (Regexp **sub,int nsub,ParseFlags flags,
               vector<re2::Splice,_std::allocator<re2::Splice>_> *splices)

{
  Regexp *pRVar1;
  bool bVar2;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar3;
  Regexp *pRVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  Regexp *b;
  int iVar9;
  ulong uVar10;
  Regexp *prefix;
  int local_54;
  ulong local_50;
  vector<re2::Splice,std::allocator<re2::Splice>> *local_48;
  Regexp **local_40;
  Regexp *local_38;
  
  if (-1 < nsub) {
    uVar6 = (ulong)(nsub + 1);
    uVar5 = 0;
    pRVar4 = (Regexp *)0x0;
    uVar10 = 0;
    local_50 = uVar6;
    local_48 = (vector<re2::Splice,std::allocator<re2::Splice>> *)splices;
    do {
      b = pRVar4;
      if (uVar5 < (uint)nsub) {
        pRVar1 = sub[uVar5];
        if (pRVar1->op_ == '\x02') {
          b = (Regexp *)0x0;
        }
        else {
          b = pRVar1;
          if ((pRVar1->op_ == '\x05') && (1 < pRVar1->nsub_)) {
            b = (Regexp *)0x0;
            if ((*(pRVar1->field_5).submany_)->op_ != '\x02') {
              b = *(pRVar1->field_5).submany_;
            }
          }
        }
        if (pRVar4 == (Regexp *)0x0) goto LAB_001bf496;
        if (8 < pRVar4->op_ - 0xc) {
          if ((pRVar4->op_ == 10) &&
             ((pRVar4->field_7).field_0.min_ == (pRVar4->field_7).field_0.max_)) {
            if (pRVar4->nsub_ < 2) {
              paVar3 = &pRVar4->field_5;
            }
            else {
              paVar3 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(pRVar4->field_5).submany_;
            }
            if ((paVar3->subone_->op_ < 0x15) &&
               ((0x103008U >> (paVar3->subone_->op_ & 0x1f) & 1) != 0)) goto LAB_001bf438;
          }
          goto LAB_001bf496;
        }
LAB_001bf438:
        bVar2 = Regexp::Equal(pRVar4,b);
        if (!bVar2) goto LAB_001bf496;
      }
      else {
LAB_001bf496:
        iVar9 = (int)uVar10;
        if (uVar5 != iVar9 + 1 && uVar5 != uVar10) {
          local_38 = Regexp::Incref(pRVar4);
          uVar8 = (ulong)iVar9;
          uVar6 = uVar8;
          if ((long)uVar8 < (long)uVar5) {
            do {
              uVar7 = uVar6 + 1;
              pRVar4 = Regexp::RemoveLeadingRegexp(sub[uVar6]);
              sub[uVar6] = pRVar4;
              uVar6 = uVar7;
            } while ((uVar7 & 0xffffffff) != uVar5);
          }
          local_40 = sub + uVar8;
          local_54 = (int)uVar5 - iVar9;
          std::vector<re2::Splice,std::allocator<re2::Splice>>::
          emplace_back<re2::Regexp*&,re2::Regexp**,int>(local_48,&local_38,&local_40,&local_54);
          uVar6 = local_50;
        }
        pRVar4 = b;
        if (uVar5 < (uint)nsub) {
          uVar10 = uVar5 & 0xffffffff;
        }
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar6);
  }
  return;
}

Assistant:

void FactorAlternationImpl::Round2(Regexp** sub, int nsub,
                                   Regexp::ParseFlags flags,
                                   std::vector<Splice>* splices) {
  // Round 2: Factor out common simple prefixes,
  // just the first piece of each concatenation.
  // This will be good enough a lot of the time.
  //
  // Complex subexpressions (e.g. involving quantifiers)
  // are not safe to factor because that collapses their
  // distinct paths through the automaton, which affects
  // correctness in some cases.
  int start = 0;
  Regexp* first = NULL;
  for (int i = 0; i <= nsub; i++) {
    // Invariant: sub[start:i] consists of regexps that all
    // begin with first.
    Regexp* first_i = NULL;
    if (i < nsub) {
      first_i = Regexp::LeadingRegexp(sub[i]);
      if (first != NULL &&
          // first must be an empty-width op
          // OR a char class, any char or any byte
          // OR a fixed repeat of a literal, char class, any char or any byte.
          (first->op() == kRegexpBeginLine ||
           first->op() == kRegexpEndLine ||
           first->op() == kRegexpWordBoundary ||
           first->op() == kRegexpNoWordBoundary ||
           first->op() == kRegexpBeginText ||
           first->op() == kRegexpEndText ||
           first->op() == kRegexpCharClass ||
           first->op() == kRegexpAnyChar ||
           first->op() == kRegexpAnyByte ||
           (first->op() == kRegexpRepeat &&
            first->min() == first->max() &&
            (first->sub()[0]->op() == kRegexpLiteral ||
             first->sub()[0]->op() == kRegexpCharClass ||
             first->sub()[0]->op() == kRegexpAnyChar ||
             first->sub()[0]->op() == kRegexpAnyByte))) &&
          Regexp::Equal(first, first_i))
        continue;
    }

    // Found end of a run with common leading regexp:
    // sub[start:i] all begin with first,
    // but sub[i] does not.
    if (i == start) {
      // Nothing to do - first iteration.
    } else if (i == start+1) {
      // Just one: don't bother factoring.
    } else {
      Regexp* prefix = first->Incref();
      for (int j = start; j < i; j++)
        sub[j] = Regexp::RemoveLeadingRegexp(sub[j]);
      splices->emplace_back(prefix, sub + start, i - start);
    }

    // Prepare for next iteration (if there is one).
    if (i < nsub) {
      start = i;
      first = first_i;
    }
  }
}